

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void __thiscall Block<float>::verify_block(Block<float> *this,ProxyWithLink *cp)

{
  size_t *psVar1;
  float fVar2;
  CollectivesList *pCVar3;
  pointer pfVar4;
  ostream *poVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  
  pfVar4 = (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish == pfVar4) {
    p_Var7 = (_List_node_base *)0x0;
  }
  else {
    p_Var6 = (_List_node_base *)0x0;
    do {
      fVar2 = pfVar4[(long)p_Var6];
      if ((fVar2 < this->min) || (this->max <= fVar2 && fVar2 != this->max)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Warning: ",9);
        poVar5 = std::ostream::_M_insert<double>
                           ((double)(this->values).super__Vector_base<float,_std::allocator<float>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)p_Var6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," outside of [",0xd);
        poVar5 = std::ostream::_M_insert<double>((double)this->min);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        poVar5 = std::ostream::_M_insert<double>((double)this->max);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      p_Var6 = (_List_node_base *)((long)&p_Var6->_M_next + 1);
      pfVar4 = (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      p_Var7 = (_List_node_base *)
               ((long)(this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pfVar4 >> 2);
    } while (p_Var6 < p_Var7);
  }
  pCVar3 = (cp->super_Proxy).collectives_;
  p_Var6 = (_List_node_base *)operator_new(0x20);
  p_Var6->_M_next = (_List_node_base *)&PTR_init_0014ec50;
  p_Var6->_M_prev = p_Var7;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = p_Var6;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar1 = &(pCVar3->super_list<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>).
            super__List_base<diy::Master::Collective,_std::allocator<diy::Master::Collective>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void          verify_block(const diy::Master::ProxyWithLink& cp)
  {
    for (size_t i = 0; i < values.size(); ++i)
      if (values[i] < min || values[i] > max)
        std::cout << "Warning: " << values[i] << " outside of [" << min << "," << max << "]" << std::endl;

    cp.all_reduce(values.size(), std::plus<size_t>());
  }